

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O3

void __thiscall
ot::commissioner::CommissionerImpl::SetSecurePendingDataset
          (CommissionerImpl *this,ErrorHandler *aHandler,uint32_t aMaxRetrievalTimer,
          PendingOperationalDataset *aDataset)

{
  char cVar1;
  type tVar2;
  pointer puVar3;
  int iVar4;
  char *pcVar5;
  long *plVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  _func_void *p_Var8;
  uint64_t aInteger;
  size_t *psVar9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *pcVar10;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  Error error;
  ByteArray secureDissemination;
  writer write;
  string uri;
  anon_class_32_1_d0c21527 onResponse;
  Request request;
  anon_class_272_4_c83933d0 onMeshLocalPrefixResponse;
  undefined1 local_390 [8];
  pointer local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_380;
  undefined1 local_368 [8];
  _Alloc_hider _Stack_360;
  undefined1 local_358 [24];
  parse_func local_340 [1];
  type local_330;
  undefined1 *local_328;
  long local_320;
  undefined1 local_318 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  ProxyClient *local_2e0;
  Address local_2d8;
  ByteArray local_2b8;
  _Any_data local_298;
  code *local_288;
  code *pcStack_280;
  undefined1 local_270 [32];
  undefined1 *local_250;
  undefined8 local_248;
  undefined1 local_240 [16];
  _Any_data local_230;
  code *local_220;
  _Any_data local_210;
  code *local_200;
  undefined1 local_1f0 [8];
  _Alloc_hider local_1e8;
  char local_1d8 [16];
  Message local_1c8;
  CommissionerImpl *local_140;
  function<void_(ot::commissioner::Error)> local_138;
  uint32_t local_118;
  undefined1 local_110 [220];
  undefined4 local_34;
  
  local_328 = local_318;
  local_330 = none_type;
  local_320 = 0;
  local_318[0] = 0;
  local_2d8.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d8.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d8.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_250 = local_240;
  local_248 = 0;
  local_240[0] = 0;
  coap::Message::Message(&local_1c8,kConfirmable,kPost);
  std::function<void_(ot::commissioner::Error)>::function
            ((function<void_(ot::commissioner::Error)> *)&local_210,aHandler);
  local_140 = this;
  std::function<void_(ot::commissioner::Error)>::function(&local_138,aHandler);
  local_118 = aMaxRetrievalTimer;
  ActiveOperationalDataset::ActiveOperationalDataset
            ((ActiveOperationalDataset *)local_110,&aDataset->super_ActiveOperationalDataset);
  local_34 = *(undefined4 *)&(aDataset->mPendingTimestamp).field_0x4;
  local_110._212_8_ = *(undefined8 *)&(aDataset->super_ActiveOperationalDataset).field_0xd4;
  if (((aDataset->super_ActiveOperationalDataset).mPresentFlags & 0x20) == 0) {
    local_368 = (undefined1  [8])((ulong)local_368 & 0xffffffff00000000);
    pcVar5 = "Delay Timer is mandatory for a Secure Pending Operational Dataset";
    _Stack_360._M_p = "Delay Timer is mandatory for a Secure Pending Operational Dataset";
    local_358._0_8_ = (pointer)0x41;
    local_358._8_8_ = 0;
    local_340[0] = (parse_func)0x0;
    local_358._16_8_ = (format_string_checker<char> *)local_368;
    local_270._0_8_ = (format_string_checker<char> *)local_368;
    do {
      cVar1 = *pcVar5;
      pcVar10 = pcVar5;
      while (cVar1 != '{') {
        pcVar10 = pcVar10 + 1;
        if (pcVar10 == "") {
          fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()((writer *)local_270,pcVar5,"");
          goto LAB_0019990b;
        }
        cVar1 = *pcVar10;
      }
      fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()((writer *)local_270,pcVar5,pcVar10);
      pcVar5 = fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar10,"",(format_string_checker<char> *)local_368);
    } while (pcVar5 != "");
LAB_0019990b:
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_368;
    fmt::v10::vformat_abi_cxx11_
              (&local_308,(v10 *)"Delay Timer is mandatory for a Secure Pending Operational Dataset"
               ,(string_view)ZEXT816(0x41),args);
    local_390._0_4_ = 2;
    local_388 = (pointer)(local_380._M_local_buf + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_388,local_308._M_dataplus._M_p,
               local_308._M_dataplus._M_p + local_308._M_string_length);
LAB_00199b11:
    local_330 = local_390._0_4_;
    std::__cxx11::string::operator=((string *)&local_328,(string *)&local_388);
    if (local_388 != (pointer)(local_380._M_local_buf + 8)) {
      operator_delete(local_388);
    }
    paVar7 = &local_308.field_2;
  }
  else {
    iVar4 = (*(this->super_Commissioner)._vptr_Commissioner[9])(this);
    if ((char)iVar4 == '\0') {
      local_368 = (undefined1  [8])((ulong)local_368 & 0xffffffff00000000);
      _Stack_360._M_p = "the commissioner is not active";
      local_358._0_8_ = (pointer)0x1e;
      local_358._8_8_ = 0;
      local_340[0] = (parse_func)0x0;
      pcVar5 = "the commissioner is not active";
      local_358._16_8_ = (format_string_checker<char> *)local_368;
      do {
        pcVar10 = pcVar5 + 1;
        if (*pcVar5 == '}') {
          if ((pcVar10 == "") || (*pcVar10 != '}')) {
            fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar10 = pcVar5 + 2;
        }
        else if (*pcVar5 == '{') {
          pcVar10 = fmt::v10::detail::
                    parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                              (pcVar5,"",(format_string_checker<char> *)local_368);
        }
        pcVar5 = pcVar10;
      } while (pcVar10 != "");
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)local_368;
      fmt::v10::vformat_abi_cxx11_(&local_308,(v10 *)0x22bb54,(string_view)ZEXT816(0x1e),args_00);
      local_390._0_4_ = 0xf;
      local_388 = (pointer)(local_380._M_local_buf + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_388,local_308._M_dataplus._M_p,
                 local_308._M_dataplus._M_p + local_308._M_string_length);
      goto LAB_00199b11;
    }
    iVar4 = (*(this->super_Commissioner)._vptr_Commissioner[10])(this);
    if ((char)iVar4 == '\0') {
      local_368 = (undefined1  [8])((ulong)local_368 & 0xffffffff00000000);
      pcVar5 = "sending MGMT_SEC_PENDING_SET.req is only valid in CCM mode";
      _Stack_360._M_p = "sending MGMT_SEC_PENDING_SET.req is only valid in CCM mode";
      local_358._0_8_ = (pointer)0x3a;
      local_358._8_8_ = 0;
      local_340[0] = (parse_func)0x0;
      local_358._16_8_ = (format_string_checker<char> *)local_368;
      local_270._0_8_ = (format_string_checker<char> *)local_368;
      do {
        cVar1 = *pcVar5;
        pcVar10 = pcVar5;
        while (cVar1 != '{') {
          pcVar10 = pcVar10 + 1;
          if (pcVar10 == "") {
            fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()((writer *)local_270,pcVar5,"");
            goto LAB_00199ac0;
          }
          cVar1 = *pcVar10;
        }
        fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()((writer *)local_270,pcVar5,pcVar10);
        pcVar5 = fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar10,"",(format_string_checker<char> *)local_368);
      } while (pcVar5 != "");
LAB_00199ac0:
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)local_368;
      fmt::v10::vformat_abi_cxx11_
                (&local_308,(v10 *)"sending MGMT_SEC_PENDING_SET.req is only valid in CCM mode",
                 (string_view)ZEXT816(0x3a),args_01);
      local_390._0_4_ = 0xf;
      local_388 = (pointer)(local_380._M_local_buf + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_388,local_308._M_dataplus._M_p,
                 local_308._M_dataplus._M_p + local_308._M_string_length);
      goto LAB_00199b11;
    }
    local_2e0 = &this->mProxyClient;
    if ((this->mProxyClient).mMeshLocalPrefix.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->mProxyClient).mMeshLocalPrefix.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_288 = (code *)0x0;
      pcStack_280 = (code *)0x0;
      local_298._M_unused._M_object = (void *)0x0;
      local_298._8_8_ = 0;
      p_Var8 = (_func_void *)operator_new(0x110);
      *(CommissionerImpl **)p_Var8 = local_140;
      std::function<void_(ot::commissioner::Error)>::function
                ((function<void_(ot::commissioner::Error)> *)(p_Var8 + 8),&local_138);
      *(uint32_t *)(p_Var8 + 0x28) = local_118;
      ActiveOperationalDataset::ActiveOperationalDataset
                ((ActiveOperationalDataset *)(p_Var8 + 0x30),(ActiveOperationalDataset *)local_110);
      *(undefined4 *)(p_Var8 + 0x10c) = local_34;
      *(undefined8 *)(p_Var8 + 0x104) = local_110._212_8_;
      pcStack_280 = std::
                    _Function_handler<void_(ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:877:38)>
                    ::_M_invoke;
      local_288 = std::
                  _Function_handler<void_(ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:877:38)>
                  ::_M_manager;
      local_298._M_unused._0_8_ = (undefined8)p_Var8;
      ProxyClient::FetchMeshLocalPrefix(local_2e0,(ErrorHandler *)&local_298);
      if (local_288 != (code *)0x0) {
        (*local_288)(&local_298,&local_298,__destroy_functor);
      }
      goto LAB_00199b4b;
    }
    local_390 = (undefined1  [8])&local_380;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"/c/sp","");
    coap::Message::SetUriPath((Error *)local_368,&local_1c8,(string *)local_390);
    local_330 = local_368._0_4_;
    std::__cxx11::string::operator=((string *)&local_328,(string *)&_Stack_360);
    tVar2 = local_330;
    if (_Stack_360._M_p != local_358 + 8) {
      operator_delete(_Stack_360._M_p);
    }
    if (local_390 != (undefined1  [8])&local_380) {
      operator_delete((void *)local_390);
    }
    if (tVar2 != none_type) goto LAB_00199b4b;
    iVar4 = (*(this->super_Commissioner)._vptr_Commissioner[7])(this);
    tlv::Tlv::Tlv((Tlv *)local_390,kCommissionerSessionId,(uint16_t)iVar4,kMeshCoP);
    AppendTlv((Error *)local_368,&local_1c8,(Tlv *)local_390);
    local_330 = local_368._0_4_;
    std::__cxx11::string::operator=((string *)&local_328,(string *)&_Stack_360);
    tVar2 = local_330;
    if (_Stack_360._M_p != local_358 + 8) {
      operator_delete(_Stack_360._M_p);
    }
    if (local_388 != (pointer)0x0) {
      operator_delete(local_388);
    }
    if (tVar2 != none_type) goto LAB_00199b4b;
    ProxyClient::GetAnycastLocator((Address *)local_368,local_2e0,0xfc38);
    puVar3 = local_2d8.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_2d8.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_368;
    local_2d8.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)_Stack_360._M_p;
    local_2d8.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_358._0_8_;
    local_368 = (undefined1  [8])0x0;
    _Stack_360._M_p = (char *)0x0;
    local_358._0_8_ = (pointer)0x0;
    if (((size_t *)puVar3 != (size_t *)0x0) &&
       (operator_delete(puVar3), local_368 != (undefined1  [8])0x0)) {
      operator_delete((void *)local_368);
    }
    Address::ToString_abi_cxx11_((string *)local_270,&local_2d8);
    std::operator+(&local_308,"coaps://[",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_308);
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 == paVar7) {
      local_380._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_380._8_8_ = plVar6[3];
      local_390 = (undefined1  [8])&local_380;
    }
    else {
      local_380._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_390 = (undefined1  [8])*plVar6;
    }
    local_388 = (pointer)plVar6[1];
    *plVar6 = (long)paVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append(local_390);
    psVar9 = (size_t *)(plVar6 + 2);
    if ((size_t *)*plVar6 == psVar9) {
      local_358._0_8_ = *psVar9;
      local_358._8_8_ = plVar6[3];
      local_368 = (undefined1  [8])local_358;
    }
    else {
      local_358._0_8_ = *psVar9;
      local_368 = (undefined1  [8])*plVar6;
    }
    _Stack_360._M_p = (pointer)plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_250,(string *)local_368);
    if (local_368 != (undefined1  [8])local_358) {
      operator_delete((void *)local_368);
    }
    if (local_390 != (undefined1  [8])&local_380) {
      operator_delete((void *)local_390);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p);
    }
    if ((format_string_checker<char> *)local_270._0_8_ !=
        (format_string_checker<char> *)(local_270 + 0x10)) {
      operator_delete((void *)local_270._0_8_);
    }
    aInteger = Timestamp::Encode(&aDataset->mPendingTimestamp);
    utils::Encode<unsigned_long>(&local_2b8,aInteger);
    utils::Encode<unsigned_int>(&local_2b8,aMaxRetrievalTimer);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_2b8,
               local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
    tlv::Tlv::Tlv((Tlv *)local_390,kSecureDissemination,&local_2b8,kMeshCoP);
    AppendTlv((Error *)local_368,&local_1c8,(Tlv *)local_390);
    local_330 = local_368._0_4_;
    std::__cxx11::string::operator=((string *)&local_328,(string *)&_Stack_360);
    tVar2 = local_330;
    if (_Stack_360._M_p != local_358 + 8) {
      operator_delete(_Stack_360._M_p);
    }
    if (local_388 != (pointer)0x0) {
      operator_delete(local_388);
    }
    if (tVar2 != none_type) goto LAB_00199b4b;
    EncodePendingOperationalDataset((Error *)local_368,&local_1c8,aDataset);
    local_330 = local_368._0_4_;
    std::__cxx11::string::operator=((string *)&local_328,(string *)&_Stack_360);
    tVar2 = local_330;
    if (_Stack_360._M_p != local_358 + 8) {
      operator_delete(_Stack_360._M_p);
    }
    if (tVar2 != none_type) goto LAB_00199b4b;
    iVar4 = (*(this->super_Commissioner)._vptr_Commissioner[10])(this);
    if ((char)iVar4 != '\0') {
      SignRequest((Error *)local_368,this,&local_1c8,kMeshCoP,true);
      local_330 = local_368._0_4_;
      std::__cxx11::string::operator=((string *)&local_328,(string *)&_Stack_360);
      tVar2 = local_330;
      if (_Stack_360._M_p != local_358 + 8) {
        operator_delete(_Stack_360._M_p);
      }
      if (tVar2 != none_type) goto LAB_00199b4b;
    }
    std::function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)>::
    function<ot::commissioner::CommissionerImpl::SetSecurePendingDataset(std::function<void(ot::commissioner::Error)>,unsigned_int,ot::commissioner::PendingOperationalDataset_const&)::__4&,void>
              ((function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)> *)
               local_230._M_pod_data,(anon_class_32_1_d0c21527 *)&local_210);
    ProxyClient::SendRequest(local_2e0,&local_1c8,(ResponseHandler *)&local_230,&local_2d8,0xf0bf);
    if (local_220 != (code *)0x0) {
      (*local_220)(&local_230,&local_230,__destroy_functor);
    }
    local_368 = (undefined1  [8])local_358;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"mgmt","");
    fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    args_02.field_1.args_ = in_R9.args_;
    args_02.desc_ = (unsigned_long_long)&local_308;
    fmt::v10::vformat_abi_cxx11_
              ((string *)local_390,(v10 *)"sent MGMT_SEC_PENDING_SET.req",(string_view)ZEXT816(0x1d)
               ,args_02);
    Log(kDebug,(string *)local_368,(string *)local_390);
    if (local_390 != (undefined1  [8])&local_380) {
      operator_delete((void *)local_390);
    }
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_358;
    local_308._M_dataplus._M_p = (pointer)local_368;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != paVar7) {
    operator_delete(local_308._M_dataplus._M_p);
  }
LAB_00199b4b:
  if (local_330 != none_type) {
    local_1f0._0_4_ = local_330;
    local_1e8._M_p = local_1d8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_1e8,local_328,local_328 + local_320);
    if ((aHandler->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*aHandler->_M_invoker)((_Any_data *)aHandler,(Error *)local_1f0);
    if (local_1e8._M_p != local_1d8) {
      operator_delete(local_1e8._M_p);
    }
  }
  SetSecurePendingDataset(std::function<void(ot::commissioner::Error)>,unsigned_int,ot::commissioner::PendingOperationalDataset_const&)
  ::$_0::~__0((__0 *)&local_140);
  if (local_200 != (code *)0x0) {
    (*local_200)(&local_210,&local_210,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8.mRequestUri._M_dataplus._M_p != &local_1c8.mRequestUri.field_2) {
    operator_delete(local_1c8.mRequestUri._M_dataplus._M_p);
  }
  if (local_1c8.mPayload.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.mPayload.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<ot::commissioner::coap::OptionType,_std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>,_std::_Select1st<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>,_std::less<ot::commissioner::coap::OptionType>,_std::allocator<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>_>
  ::~_Rb_tree(&local_1c8.mOptions._M_t);
  if (local_250 != local_240) {
    operator_delete(local_250);
  }
  if (local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((size_t *)
      local_2d8.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (size_t *)0x0) {
    operator_delete(local_2d8.mBytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_328 != local_318) {
    operator_delete(local_328);
  }
  return;
}

Assistant:

void CommissionerImpl::SetSecurePendingDataset(ErrorHandler                     aHandler,
                                               uint32_t                         aMaxRetrievalTimer,
                                               const PendingOperationalDataset &aDataset)
{
    Error         error;
    Address       pbbrAddr;
    ByteArray     secureDissemination;
    std::string   uri;
    coap::Request request{coap::Type::kConfirmable, coap::Code::kPost};

    auto onResponse = [aHandler](const coap::Response *aResponse, Error aError) {
        aHandler(HandleStateResponse(aResponse, aError));
    };

    auto onMeshLocalPrefixResponse = [=](Error aError) {
        if (aError == ErrorCode::kNone)
        {
            SetSecurePendingDataset(aHandler, aMaxRetrievalTimer, aDataset);
        }
        else
        {
            aHandler(aError);
        }
    };

    // Delay timer is mandatory.
    VerifyOrExit(aDataset.mPresentFlags & PendingOperationalDataset::kDelayTimerBit,
                 error = ERROR_INVALID_ARGS("Delay Timer is mandatory for a Secure Pending Operational Dataset"));

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));
    VerifyOrExit(IsCcmMode(),
                 error = ERROR_INVALID_STATE("sending MGMT_SEC_PENDING_SET.req is only valid in CCM mode"));

    if (mProxyClient.GetMeshLocalPrefix().empty())
    {
        mProxyClient.FetchMeshLocalPrefix(onMeshLocalPrefixResponse);
        ExitNow();
    }

    SuccessOrExit(error = request.SetUriPath(uri::kMgmtSecPendingSet));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kCommissionerSessionId, GetSessionId()}));

    pbbrAddr = mProxyClient.GetAnycastLocator(kPrimaryBbrAloc16);
    uri      = "coaps://[" + pbbrAddr.ToString() + "]" + uri::kMgmtPendingGet;

    utils::Encode(secureDissemination, aDataset.mPendingTimestamp.Encode());
    utils::Encode(secureDissemination, aMaxRetrievalTimer);
    secureDissemination.insert(secureDissemination.end(), uri.begin(), uri.end());
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kSecureDissemination, secureDissemination}));

    SuccessOrExit(error = EncodePendingOperationalDataset(request, aDataset));

    if (IsCcmMode())
    {
        SuccessOrExit(error = SignRequest(request));
    }

    mProxyClient.SendRequest(request, onResponse, pbbrAddr, kDefaultMmPort);

    LOG_DEBUG(LOG_REGION_MGMT, "sent MGMT_SEC_PENDING_SET.req");

exit:
    if (error != ErrorCode::kNone)
    {
        aHandler(error);
    }
}